

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O2

void SpiritKarma(void)

{
  long lVar1;
  ostream *poVar2;
  int iVar3;
  bool bVar4;
  undefined1 local_1430 [8];
  random_device _rdev;
  char buf [64];
  param_type local_60;
  uniform_int_distribution<int> _dist;
  ResultType _result;
  Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> _prof;
  char *beg;
  result_type i;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"spirit karma");
  std::operator<<(poVar2,"... ");
  std::ostream::flush();
  std::random_device::random_device((random_device *)local_1430);
  local_60._M_a = -0x80000000;
  local_60._M_b = 0x7fffffff;
  _result.__r = (rep)&_dist;
  _prof.mResult = (duration<double,_std::ratio<1L,_1L>_> *)std::chrono::_V2::steady_clock::now();
  iVar3 = 10000000;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    beg._4_4_ = std::uniform_int_distribution<int>::operator()
                          ((uniform_int_distribution<int> *)&local_60,(random_device *)local_1430);
    _prof.mStart.__d.__r = (duration)(duration)((long)&_rdev.field_0 + 0x1380);
    boost::spirit::karma::generate<char*,boost::spirit::terminal<boost::spirit::tag::auto_>,int>
              ((char **)&_prof.mStart,(terminal<boost::spirit::tag::auto_> *)&boost::spirit::auto_,
               (int *)((long)&beg + 4));
    *(undefined1 *)_prof.mStart.__d.__r = 0;
  }
  Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>::~Profiler
            ((Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *)&_result);
  std::random_device::~random_device((random_device *)local_1430);
  lVar1 = std::cout;
  *(uint *)(std::locale::classic + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::locale::classic + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) = 3;
  poVar2 = std::ostream::_M_insert<double>((double)_dist._M_param);
  poVar2 = std::operator<<(poVar2,"s");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void SpiritKarma()
{
    char buf[64];
    RANDOM_PROFILING_BEGIN("spirit karma")
    char *beg = buf;
    boost::spirit::karma::generate(beg, boost::spirit::karma::auto_, i);
    *beg = 0;
    RANDOM_PROFILING_END()
}